

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.cpp
# Opt level: O0

int __thiscall
VC1Frame::decode_frame_direct
          (VC1Frame *this,VC1SequenceHeader *sequenceHdr,uint8_t *buffer,uint8_t *end)

{
  BitStreamException *e;
  uint8_t *end_local;
  uint8_t *buffer_local;
  VC1SequenceHeader *sequenceHdr_local;
  VC1Frame *this_local;
  
  BitStreamReader::setBuffer((BitStreamReader *)this,buffer,end);
  if ((int)sequenceHdr->profile < 3) {
    this_local._4_4_ = vc1_parse_frame_header(this,sequenceHdr);
  }
  else {
    this_local._4_4_ = vc1_parse_frame_header_adv(this,sequenceHdr);
  }
  return this_local._4_4_;
}

Assistant:

int VC1Frame::decode_frame_direct(const VC1SequenceHeader& sequenceHdr, uint8_t* buffer, const uint8_t* end)
{
    try
    {
        bitReader.setBuffer(buffer, end);  // skip 00 00 01 xx marker
        if (sequenceHdr.profile < Profile::ADVANCED)
            return vc1_parse_frame_header(sequenceHdr);
        return vc1_parse_frame_header_adv(sequenceHdr);
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}